

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O0

void free_adiak_type(adiak_datatype_t *t)

{
  int iVar1;
  int local_14;
  int i;
  adiak_datatype_t *t_local;
  
  if ((t != (adiak_datatype_t *)0x0) && (iVar1 = is_basetype(t->dtype), iVar1 == 0)) {
    for (local_14 = 0; local_14 < t->num_subtypes; local_14 = local_14 + 1) {
      free_adiak_type(t->subtype[local_14]);
    }
    if (t->num_subtypes != 0) {
      free(t->subtype);
    }
    free(t);
  }
  return;
}

Assistant:

static void free_adiak_type(adiak_datatype_t *t)
{
   int i;
   if (t == NULL)
      return;
   if (is_basetype(t->dtype))
      return;
   for (i = 0; i < t->num_subtypes; i++) {
      free_adiak_type(t->subtype[i]);
   }
   if (t->num_subtypes)
      free(t->subtype);
   free(t);
}